

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilsTest.hpp
# Opt level: O1

void Qentem::Test::TestTrim(QTest *test)

{
  uint *offset_00;
  uint *length_00;
  SizeT length;
  SizeT offset;
  uint local_3c [3];
  
  offset_00 = local_3c + 2;
  local_3c[2] = 0;
  length_00 = local_3c + 1;
  local_3c[1] = 0;
  StringUtils::Trim<char,unsigned_int>("",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x1ca);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x1cb);
  local_3c[2] = 0;
  local_3c[1] = 1;
  StringUtils::Trim<char,unsigned_int>(" ",offset_00,length_00);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x1d0);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x1d1);
  local_3c[2] = 0;
  local_3c[1] = 1;
  StringUtils::Trim<char,unsigned_int>("  ",offset_00,length_00);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x1d6);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x1d7);
  local_3c[2] = 0;
  local_3c[1] = 2;
  StringUtils::Trim<char,unsigned_int>("  ",offset_00,length_00);
  local_3c[0] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x1dc);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x1dd);
  local_3c[2] = 0;
  local_3c[1] = 2;
  StringUtils::Trim<char,unsigned_int>(" a",offset_00,length_00);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x1e2);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x1e3);
  local_3c[2] = 0;
  local_3c[1] = 4;
  StringUtils::Trim<char,unsigned_int>(" abc",offset_00,length_00);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x1e8);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x1e9);
  local_3c[2] = 1;
  local_3c[1] = 1;
  StringUtils::Trim<char,unsigned_int>(" a",offset_00,length_00);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x1ee);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x1ef);
  local_3c[2] = 1;
  local_3c[1] = 3;
  StringUtils::Trim<char,unsigned_int>(" abc",offset_00,length_00);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,500);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x1f5);
  local_3c[2] = 2;
  local_3c[1] = 1;
  StringUtils::Trim<char,unsigned_int>("  a",offset_00,length_00);
  local_3c[0] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x1fa);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x1fb);
  local_3c[2] = 2;
  local_3c[1] = 3;
  StringUtils::Trim<char,unsigned_int>("  abc",offset_00,length_00);
  local_3c[0] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x200);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x201);
  local_3c[2] = 0;
  local_3c[1] = 3;
  StringUtils::Trim<char,unsigned_int>("  a",offset_00,length_00);
  local_3c[0] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x206);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x207);
  local_3c[2] = 0;
  local_3c[1] = 5;
  StringUtils::Trim<char,unsigned_int>("  abc",offset_00,length_00);
  local_3c[0] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x20c);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x20d);
  local_3c[2] = 0;
  local_3c[1] = 4;
  StringUtils::Trim<char,unsigned_int>("   a",offset_00,length_00);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x212);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x213);
  local_3c[2] = 0;
  local_3c[1] = 6;
  StringUtils::Trim<char,unsigned_int>("   abc",offset_00,length_00);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x218);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x219);
  local_3c[2] = 0;
  local_3c[1] = 2;
  StringUtils::Trim<char,unsigned_int>("a ",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x21e);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x21f);
  local_3c[2] = 0;
  local_3c[1] = 4;
  StringUtils::Trim<char,unsigned_int>("abc ",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x224);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x225);
  local_3c[2] = 0;
  local_3c[1] = 1;
  StringUtils::Trim<char,unsigned_int>("a ",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x22a);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x22b);
  local_3c[2] = 0;
  local_3c[1] = 3;
  StringUtils::Trim<char,unsigned_int>("abc ",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x230);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x231);
  local_3c[2] = 0;
  local_3c[1] = 1;
  StringUtils::Trim<char,unsigned_int>("a  ",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x236);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x237);
  local_3c[2] = 0;
  local_3c[1] = 3;
  StringUtils::Trim<char,unsigned_int>("abc  ",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x23c);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x23d);
  local_3c[2] = 0;
  local_3c[1] = 3;
  StringUtils::Trim<char,unsigned_int>("a  ",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x242);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x243);
  local_3c[2] = 0;
  local_3c[1] = 5;
  StringUtils::Trim<char,unsigned_int>("abc  ",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x248);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x249);
  local_3c[2] = 0;
  local_3c[1] = 4;
  StringUtils::Trim<char,unsigned_int>("a   ",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x24e);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x24f);
  local_3c[2] = 0;
  local_3c[1] = 6;
  StringUtils::Trim<char,unsigned_int>("abc   ",offset_00,length_00);
  local_3c[0] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x254);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x255);
  local_3c[2] = 0;
  local_3c[1] = 3;
  StringUtils::Trim<char,unsigned_int>(" a ",offset_00,length_00);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x25a);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x25b);
  local_3c[2] = 0;
  local_3c[1] = 5;
  StringUtils::Trim<char,unsigned_int>(" abc ",offset_00,length_00);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x260);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x261);
  local_3c[2] = 0;
  local_3c[1] = 5;
  StringUtils::Trim<char,unsigned_int>("  a  ",offset_00,length_00);
  local_3c[0] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x266);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x267);
  local_3c[2] = 0;
  local_3c[1] = 7;
  StringUtils::Trim<char,unsigned_int>("  abc  ",offset_00,length_00);
  local_3c[0] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x26c);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x26d);
  local_3c[2] = 0;
  local_3c[1] = 7;
  StringUtils::Trim<char,unsigned_int>("   a   ",offset_00,length_00);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x272);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x273);
  local_3c[2] = 0;
  local_3c[1] = 9;
  StringUtils::Trim<char,unsigned_int>("   abc   ",offset_00,length_00);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x278);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x279);
  local_3c[2] = 1;
  local_3c[1] = 1;
  StringUtils::Trim<char,unsigned_int>(" a ",offset_00,length_00);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x27e);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x27f);
  local_3c[2] = 1;
  local_3c[1] = 3;
  StringUtils::Trim<char,unsigned_int>(" abc ",offset_00,length_00);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x284);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x285);
  local_3c[2] = 2;
  local_3c[1] = 1;
  StringUtils::Trim<char,unsigned_int>("  a  ",offset_00,length_00);
  local_3c[0] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x28a);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x28b);
  local_3c[2] = 2;
  local_3c[1] = 3;
  StringUtils::Trim<char,unsigned_int>("  abc  ",offset_00,length_00);
  local_3c[0] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x290);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x291);
  local_3c[2] = 3;
  local_3c[1] = 1;
  StringUtils::Trim<char,unsigned_int>("   a   ",offset_00,length_00);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x296);
  local_3c[0] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x297);
  local_3c[2] = 3;
  local_3c[1] = 3;
  StringUtils::Trim<char,unsigned_int>("   abc   ",offset_00,length_00);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,offset_00,local_3c,0x29c);
  local_3c[0] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,length_00,local_3c,0x29d);
  return;
}

Assistant:

static void TestTrim(QTest &test) {
    SizeT offset = 0;
    SizeT length = 0;

    StringUtils::Trim("", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim(" ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim("  ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 2;
    StringUtils::Trim("  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 0U, __LINE__);

    offset = 0;
    length = 2;
    StringUtils::Trim(" a", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim(" abc", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 1;
    length = 1;
    StringUtils::Trim(" a", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 1;
    length = 3;
    StringUtils::Trim(" abc", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 2;
    length = 1;
    StringUtils::Trim("  a", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 2;
    length = 3;
    StringUtils::Trim("  abc", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("  a", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim("  abc", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim("   a", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 6;
    StringUtils::Trim("   abc", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 2;
    StringUtils::Trim("a ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim("abc ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim("a ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("abc ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 1;
    StringUtils::Trim("a  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("abc  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim("a  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim("abc  ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 4;
    StringUtils::Trim("a   ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 6;
    StringUtils::Trim("abc   ", offset, length);
    test.IsEqual(offset, 0U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 3;
    StringUtils::Trim(" a ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim(" abc ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 5;
    StringUtils::Trim("  a  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 7;
    StringUtils::Trim("  abc  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 0;
    length = 7;
    StringUtils::Trim("   a   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 0;
    length = 9;
    StringUtils::Trim("   abc   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 1;
    length = 1;
    StringUtils::Trim(" a ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 1;
    length = 3;
    StringUtils::Trim(" abc ", offset, length);
    test.IsEqual(offset, 1U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 2;
    length = 1;
    StringUtils::Trim("  a  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 2;
    length = 3;
    StringUtils::Trim("  abc  ", offset, length);
    test.IsEqual(offset, 2U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);

    offset = 3;
    length = 1;
    StringUtils::Trim("   a   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 1U, __LINE__);

    offset = 3;
    length = 3;
    StringUtils::Trim("   abc   ", offset, length);
    test.IsEqual(offset, 3U, __LINE__);
    test.IsEqual(length, 3U, __LINE__);
}